

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this)

{
  Snapshot SVar1;
  bool bVar2;
  const_reference ppcVar3;
  cmListFileBacktrace local_b0;
  cmCommandContext local_60;
  Snapshot local_38;
  undefined1 local_19;
  cmMakefile *local_18;
  cmMakefile *this_local;
  cmListFileBacktrace *backtrace;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmMakefile *)__return_storage_ptr__;
  cmState::Snapshot::Snapshot(&local_38,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_60);
  SVar1.Position.Tree = local_38.Position.Tree;
  SVar1.State = local_38.State;
  SVar1.Position.Position = local_38.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__,SVar1,&local_60);
  cmCommandContext::~cmCommandContext(&local_60);
  bVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::empty
                    (&this->ContextStack);
  if (!bVar2) {
    SVar1 = this->StateSnapshot;
    ppcVar3 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->ContextStack);
    cmListFileBacktrace::cmListFileBacktrace(&local_b0,SVar1,*ppcVar3);
    cmListFileBacktrace::operator=(__return_storage_ptr__,&local_b0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace() const
{
  cmListFileBacktrace backtrace;
  if (!this->ContextStack.empty())
    {
    backtrace = cmListFileBacktrace(this->StateSnapshot,
                                    *this->ContextStack.back());
    }
  return backtrace;
}